

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qladisp.cpp
# Opt level: O2

void PrintDebugStream(stringstream *debugStream)

{
  ostream *poVar1;
  allocator<char> local_39;
  string local_38 [32];
  
  std::__cxx11::stringbuf::str();
  poVar1 = std::operator<<((ostream *)&std::cerr,local_38);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string(local_38);
  std::ios::clear((int)debugStream + (int)*(undefined8 *)(*(long *)debugStream + -0x18));
  std::__cxx11::string::string<std::allocator<char>>(local_38,"",&local_39);
  std::__cxx11::stringbuf::str((string *)(debugStream + 0x18));
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void PrintDebugStream(std::stringstream &debugStream)
{
    std::cerr << debugStream.str() << std::endl;
    debugStream.clear();
    debugStream.str("");
}